

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O3

void __thiscall
Matrix4f::Matrix4f(Matrix4f *this,Vector4f *v0,Vector4f *v1,Vector4f *v2,Vector4f *v3,
                  bool setColumns)

{
  undefined3 in_register_00000089;
  
  if (CONCAT31(in_register_00000089,setColumns) != 0) {
    setCol(this,0,v0);
    setCol(this,1,v1);
    setCol(this,2,v2);
    setCol(this,3,v3);
    return;
  }
  setRow(this,0,v0);
  setRow(this,1,v1);
  setRow(this,2,v2);
  setRow(this,3,v3);
  return;
}

Assistant:

Matrix4f::Matrix4f( const Vector4f& v0, const Vector4f& v1, const Vector4f& v2, const Vector4f& v3, bool setColumns )
{
	if( setColumns )
	{
		setCol( 0, v0 );
		setCol( 1, v1 );
		setCol( 2, v2 );
		setCol( 3, v3 );
	}
	else
	{
		setRow( 0, v0 );
		setRow( 1, v1 );
		setRow( 2, v2 );
		setRow( 3, v3 );
	}
}